

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

pid_t phosg::pid_for_name(string *name,bool search_commands,bool exclude_self)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  char *__needle;
  runtime_error *this;
  out_of_range *this_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 with_commands;
  __pid_t local_d4;
  undefined1 local_d0 [8];
  string lower_it_name;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a0;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  pid_t pid;
  pid_t self_pid;
  string lower_name;
  bool exclude_self_local;
  bool search_commands_local;
  string *name_local;
  
  lower_name.field_2._M_local_buf[0xe] = exclude_self;
  lower_name.field_2._M_local_buf[0xf] = search_commands;
  tolower((phosg *)&pid,(int)name);
  if ((lower_name.field_2._M_local_buf[0xe] & 1U) == 0) {
    local_d4 = 0;
    with_commands = extraout_DL;
  }
  else {
    local_d4 = getpid();
    with_commands = extraout_DL_00;
  }
  __range1._4_4_ = local_d4;
  __range1._0_4_ = 0;
  list_processes_abi_cxx11_
            (&local_80,(phosg *)(ulong)((byte)lower_name.field_2._M_local_buf[0xf] & 1),
             (bool)with_commands);
  local_48 = &local_80;
  __end1 = ::std::
           unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(local_48);
  local_a0._M_cur =
       (__node_type *)
       ::std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(local_48);
  do {
    bVar2 = ::std::__detail::operator==
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ,&local_a0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      ::std::
      unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map(&local_80);
      iVar1 = (int)__range1;
      if ((int)__range1 == 0) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        ::std::out_of_range::out_of_range(this_00,"no processes found");
        __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
      }
      ::std::__cxx11::string::~string((string *)&pid);
      return iVar1;
    }
    lower_it_name.field_2._8_8_ =
         ::std::__detail::
         _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
         ::operator*(&__end1);
    tolower((phosg *)local_d0,(int)lower_it_name.field_2._8_8_ + 8);
    pcVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    __needle = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pid);
    pcVar3 = strstr(pcVar3,__needle);
    if ((pcVar3 != (char *)0x0) && ((int)__range1 != __range1._4_4_)) {
      if ((int)__range1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this,"multiple processes found");
        __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      __range1._0_4_ = *(int *)lower_it_name.field_2._8_8_;
    }
    ::std::__cxx11::string::~string((string *)local_d0);
    ::std::__detail::
    _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

pid_t pid_for_name(const string& name, bool search_commands, bool exclude_self) {
  string lower_name = tolower(name);

  pid_t self_pid = exclude_self ? getpid() : 0;

  pid_t pid = 0;
  for (const auto& it : list_processes(search_commands)) {
    string lower_it_name = tolower(it.second);
    if (!strstr(lower_it_name.c_str(), lower_name.c_str())) {
      continue;
    }

    if (pid == self_pid) {
      continue;
    }
    if (pid) {
      throw runtime_error("multiple processes found");
    }
    pid = it.first;
  }

  if (pid) {
    return pid;
  }

  throw out_of_range("no processes found");
}